

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O2

optional<pbrt::CameraRayDifferential> * __thiscall
pbrt::PerspectiveCamera::GenerateRayDifferential
          (optional<pbrt::CameraRayDifferential> *__return_storage_ptr__,PerspectiveCamera *this,
          CameraSample sample,SampledWavelengths *lambda)

{
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Point2f PVar1;
  undefined1 auVar17 [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 extraout_var [56];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  Point3<float> PVar22;
  Vector3<float> VVar23;
  Point3f PVar24;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  Tuple3<pbrt::Point3,_float> local_148;
  RayDifferential local_138;
  Tuple3<pbrt::Vector3,_float> local_d8;
  Tuple2<pbrt::Point2,_float> local_c8;
  undefined8 uStack_c0;
  RayDifferential local_b0;
  SampledSpectrum local_50;
  Tuple2<pbrt::Point2,_float> local_40;
  undefined4 local_38;
  undefined8 uVar15;
  undefined8 uVar16;
  
  auVar17 = ZEXT856(0);
  local_40 = sample.pFilm.super_Tuple2<pbrt::Point2,_float>;
  local_38 = 0;
  PVar22 = Transform::operator()
                     (&(this->super_ProjectiveCamera).cameraFromRaster,(Point3<float> *)&local_40);
  fVar18 = PVar22.super_Tuple3<pbrt::Point3,_float>.z;
  auVar4._0_8_ = PVar22.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar4._8_56_ = auVar17;
  auVar2 = auVar4._0_16_;
  local_148._0_8_ = vmovlps_avx(auVar2);
  local_b0.super_Ray.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar2);
  local_148.z = fVar18;
  local_b0.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z = fVar18;
  VVar23 = Normalize<float>((Vector3<float> *)&local_b0);
  local_138.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z =
       VVar23.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar5._0_8_ = VVar23.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar5._8_56_ = auVar17;
  local_138.super_Ray.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
           )(this->super_ProjectiveCamera).super_CameraBase.medium.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
            .bits;
  auVar20 = vfmadd231ss_fma(ZEXT416((uint)(sample.time *
                                          (this->super_ProjectiveCamera).super_CameraBase.
                                          shutterClose)),ZEXT416((uint)(1.0 - sample.time)),
                            ZEXT416((uint)(this->super_ProjectiveCamera).super_CameraBase.
                                          shutterOpen));
  local_138.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  local_138.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  local_138.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  local_138.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar5._0_16_);
  local_138.super_Ray.time = auVar20._0_4_;
  local_138.hasDifferentials = false;
  local_138.rxOrigin.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  local_138.rxOrigin.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  local_138.rxOrigin.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  local_138.ryOrigin.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  local_138.ryOrigin.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  local_138.ryOrigin.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  local_138.rxDirection.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  local_138.rxDirection.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  local_138.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  local_138.ryDirection.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  local_138.ryDirection.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  local_138.ryDirection.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  fVar19 = (this->super_ProjectiveCamera).lensRadius;
  if (0.0 < fVar19) {
    local_c8 = (Tuple2<pbrt::Point2,_float>)SampleUniformDiskConcentric(&sample.pLens);
    auVar17 = ZEXT856(0);
    uStack_c0 = extraout_XMM0_Qb;
    PVar24 = Ray::operator()(&local_138.super_Ray,
                             (this->super_ProjectiveCamera).focalDistance /
                             local_138.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z);
    local_b0.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z =
         PVar24.super_Tuple3<pbrt::Point3,_float>.z;
    auVar6._0_8_ = PVar24.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar6._8_56_ = auVar17;
    auVar20._0_4_ = fVar19 * local_c8.x;
    auVar20._4_4_ = fVar19 * local_c8.y;
    auVar20._8_4_ = fVar19 * (float)uStack_c0;
    auVar20._12_4_ = fVar19 * uStack_c0._4_4_;
    local_138.super_Ray.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar20);
    local_138.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
    auVar20 = vsubps_avx(auVar6._0_16_,auVar20);
    auVar17 = ZEXT856(auVar20._8_8_);
    local_b0.super_Ray.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar20);
    VVar23 = Normalize<float>((Vector3<float> *)&local_b0);
    local_138.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z =
         VVar23.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar7._0_8_ = VVar23.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar7._8_56_ = auVar17;
    local_138.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar7._0_16_);
    fVar19 = (this->super_ProjectiveCamera).lensRadius;
  }
  if (fVar19 <= 0.0) {
    local_138.ryOrigin.super_Tuple3<pbrt::Point3,_float>.z =
         local_138.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z;
    local_d8._0_8_ = vmovlps_avx(auVar2);
    local_138.ryOrigin.super_Tuple3<pbrt::Point3,_float>.x =
         local_138.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.x;
    local_138.ryOrigin.super_Tuple3<pbrt::Point3,_float>.y =
         local_138.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.y;
    local_138.rxOrigin.super_Tuple3<pbrt::Point3,_float>.z =
         local_138.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z;
    local_138.rxOrigin.super_Tuple3<pbrt::Point3,_float>.x =
         local_138.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.x;
    local_138.rxOrigin.super_Tuple3<pbrt::Point3,_float>.y =
         local_138.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.y;
    auVar17 = (undefined1  [56])0x0;
    local_d8.z = fVar18;
    VVar23 = Tuple3<pbrt::Vector3,float>::operator+(&local_d8,&this->dxCamera);
    local_b0.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z =
         VVar23.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar11._0_8_ = VVar23.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar11._8_56_ = auVar17;
    local_b0.super_Ray.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar11._0_16_);
    VVar23 = Normalize<float>((Vector3<float> *)&local_b0);
    local_138.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z =
         VVar23.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar12._0_8_ = VVar23.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar12._8_56_ = auVar17;
    local_138.rxDirection.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar12._0_16_);
    local_d8._0_8_ = vmovlps_avx(auVar2);
    auVar17 = (undefined1  [56])0x0;
    local_d8.z = fVar18;
    VVar23 = Tuple3<pbrt::Vector3,float>::operator+(&local_d8,&this->dyCamera);
    local_b0.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z =
         VVar23.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar13._0_8_ = VVar23.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar13._8_56_ = auVar17;
    local_b0.super_Ray.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar13._0_16_);
  }
  else {
    PVar1 = SampleUniformDiskConcentric(&sample.pLens);
    auVar17 = extraout_var;
    PVar22 = Point3<float>::operator+((Point3<float> *)&local_148,&this->dxCamera);
    uVar15 = auVar17._0_8_;
    local_b0.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z =
         PVar22.super_Tuple3<pbrt::Point3,_float>.z;
    auVar8._0_8_ = PVar22.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar8._8_56_ = auVar17;
    local_b0.super_Ray.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar8._0_16_);
    VVar23 = Normalize<float>((Vector3<float> *)&local_b0);
    fVar18 = (this->super_ProjectiveCamera).focalDistance /
             VVar23.super_Tuple3<pbrt::Vector3,_float>.z;
    local_b0.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z =
         VVar23.super_Tuple3<pbrt::Vector3,_float>.z * fVar18 + 0.0;
    local_168 = PVar1.super_Tuple2<pbrt::Point2,_float>.x;
    fStack_164 = PVar1.super_Tuple2<pbrt::Point2,_float>.y;
    fStack_160 = extraout_var._0_4_;
    fStack_15c = extraout_var._4_4_;
    auVar21._0_4_ = fVar19 * local_168;
    auVar21._4_4_ = fVar19 * fStack_164;
    auVar21._8_4_ = fVar19 * fStack_160;
    auVar21._12_4_ = fVar19 * fStack_15c;
    auVar2._0_4_ = VVar23.super_Tuple3<pbrt::Vector3,_float>.x * fVar18 + 0.0;
    auVar2._4_4_ = VVar23.super_Tuple3<pbrt::Vector3,_float>.y * fVar18 + 0.0;
    auVar2._8_4_ = (float)uVar15 * fVar18 + 0.0;
    auVar2._12_4_ = (float)((ulong)uVar15 >> 0x20) * fVar18 + 0.0;
    local_138.rxOrigin.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar21);
    local_138.rxOrigin.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
    auVar20 = vsubps_avx(auVar2,auVar21);
    auVar17 = ZEXT856(auVar20._8_8_);
    local_b0.super_Ray.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar20);
    VVar23 = Normalize<float>((Vector3<float> *)&local_b0);
    local_138.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z =
         VVar23.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar9._0_8_ = VVar23.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar9._8_56_ = auVar17;
    local_138.rxDirection.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar9._0_16_);
    PVar22 = Point3<float>::operator+((Point3<float> *)&local_148,&this->dyCamera);
    uVar16 = auVar17._0_8_;
    local_b0.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z =
         PVar22.super_Tuple3<pbrt::Point3,_float>.z;
    auVar10._0_8_ = PVar22.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar10._8_56_ = auVar17;
    local_b0.super_Ray.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar10._0_16_);
    VVar23 = Normalize<float>((Vector3<float> *)&local_b0);
    fVar19 = (this->super_ProjectiveCamera).focalDistance /
             VVar23.super_Tuple3<pbrt::Vector3,_float>.z;
    local_b0.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z =
         VVar23.super_Tuple3<pbrt::Vector3,_float>.z * fVar19 + 0.0;
    uVar15 = vmovlps_avx(auVar21);
    local_138.ryOrigin.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar15;
    local_138.ryOrigin.super_Tuple3<pbrt::Point3,_float>.y = (float)((ulong)uVar15 >> 0x20);
    local_138.ryOrigin.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
    auVar3._0_4_ = VVar23.super_Tuple3<pbrt::Vector3,_float>.x * fVar19 + 0.0;
    auVar3._4_4_ = VVar23.super_Tuple3<pbrt::Vector3,_float>.y * fVar19 + 0.0;
    auVar3._8_4_ = (float)uVar16 * fVar19 + 0.0;
    auVar3._12_4_ = (float)((ulong)uVar16 >> 0x20) * fVar19 + 0.0;
    auVar20 = vsubps_avx(auVar3,auVar21);
    auVar17 = ZEXT856(auVar20._8_8_);
    local_b0.super_Ray.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar20);
  }
  VVar23 = Normalize<float>((Vector3<float> *)&local_b0);
  local_138.ryDirection.super_Tuple3<pbrt::Vector3,_float>.z =
       VVar23.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar14._0_8_ = VVar23.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar14._8_56_ = auVar17;
  uVar15 = vmovlps_avx(auVar14._0_16_);
  local_138.ryDirection.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar15;
  local_138.ryDirection.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar15 >> 0x20);
  local_138.hasDifferentials = true;
  CameraTransform::RenderFromCamera(&local_b0,(CameraTransform *)this,&local_138);
  SampledSpectrum::SampledSpectrum(&local_50,1.0);
  __return_storage_ptr__->set = true;
  (__return_storage_ptr__->optionalValue).__align =
       (anon_struct_8_0_00000001_for___align)
       local_b0.super_Ray.o.super_Tuple3<pbrt::Point3,_float>._0_8_;
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 8) =
       CONCAT44(local_b0.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.x,
                local_b0.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z);
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0xc) =
       CONCAT44(local_b0.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.y,
                local_b0.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.x);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x14) = local_b0.super_Ray._20_8_;
  ((TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
    *)((long)&__return_storage_ptr__->optionalValue + 0x20))->bits =
       (uintptr_t)
       local_b0.super_Ray.medium.
       super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
       .bits;
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x3c) =
       CONCAT44(local_b0.ryOrigin.super_Tuple3<pbrt::Point3,_float>.z,
                local_b0.ryOrigin.super_Tuple3<pbrt::Point3,_float>.y);
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x44) =
       CONCAT44(local_b0.rxDirection.super_Tuple3<pbrt::Vector3,_float>.y,
                local_b0.rxDirection.super_Tuple3<pbrt::Vector3,_float>.x);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x4c) = local_b0._76_8_;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x54) =
       local_b0.ryDirection.super_Tuple3<pbrt::Vector3,_float>._4_8_;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = local_b0._40_8_;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) =
       local_b0.rxOrigin.super_Tuple3<pbrt::Point3,_float>._4_8_;
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x38) =
       CONCAT44(local_b0.ryOrigin.super_Tuple3<pbrt::Point3,_float>.y,
                local_b0.ryOrigin.super_Tuple3<pbrt::Point3,_float>.x);
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x40) =
       CONCAT44(local_b0.rxDirection.super_Tuple3<pbrt::Vector3,_float>.x,
                local_b0.ryOrigin.super_Tuple3<pbrt::Point3,_float>.z);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) =
       local_50.values.values._0_8_;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) =
       local_50.values.values._8_8_;
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<CameraRayDifferential> PerspectiveCamera::GenerateRayDifferential(
    CameraSample sample, SampledWavelengths &lambda) const {
    // Compute raster and camera sample positions
    Point3f pFilm = Point3f(sample.pFilm.x, sample.pFilm.y, 0);
    Point3f pCamera = cameraFromRaster(pFilm);
    Vector3f dir = Normalize(Vector3f(pCamera.x, pCamera.y, pCamera.z));
    RayDifferential ray(Point3f(0, 0, 0), dir, SampleTime(sample.time), medium);
    // Modify ray for depth of field
    if (lensRadius > 0) {
        // Sample point on lens
        Point2f pLens = lensRadius * SampleUniformDiskConcentric(sample.pLens);

        // Compute point on plane of focus
        Float ft = focalDistance / ray.d.z;
        Point3f pFocus = ray(ft);

        // Update ray for effect of lens
        ray.o = Point3f(pLens.x, pLens.y, 0);
        ray.d = Normalize(pFocus - ray.o);
    }

    // Compute offset rays for _PerspectiveCamera_ ray differentials
    if (lensRadius > 0) {
        // Compute _PerspectiveCamera_ ray differentials accounting for lens
        // Sample point on lens
        Point2f pLens = lensRadius * SampleUniformDiskConcentric(sample.pLens);

        // Compute $x$ ray differential for _PerspectiveCamera_ with lens
        Vector3f dx = Normalize(Vector3f(pCamera + dxCamera));
        Float ft = focalDistance / dx.z;
        Point3f pFocus = Point3f(0, 0, 0) + (ft * dx);
        ray.rxOrigin = Point3f(pLens.x, pLens.y, 0);
        ray.rxDirection = Normalize(pFocus - ray.rxOrigin);

        // Compute $y$ ray differential for _PerspectiveCamera_ with lens
        Vector3f dy = Normalize(Vector3f(pCamera + dyCamera));
        ft = focalDistance / dy.z;
        pFocus = Point3f(0, 0, 0) + (ft * dy);
        ray.ryOrigin = Point3f(pLens.x, pLens.y, 0);
        ray.ryDirection = Normalize(pFocus - ray.ryOrigin);

    } else {
        ray.rxOrigin = ray.ryOrigin = ray.o;
        ray.rxDirection = Normalize(Vector3f(pCamera) + dxCamera);
        ray.ryDirection = Normalize(Vector3f(pCamera) + dyCamera);
    }

    ray.hasDifferentials = true;
    return CameraRayDifferential{RenderFromCamera(ray)};
}